

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

ManagedType __thiscall cmGeneratorTarget::CheckManagedType(cmGeneratorTarget *this,string *propval)

{
  bool bVar1;
  ulong uVar2;
  string *propval_local;
  cmGeneratorTarget *this_local;
  
  uVar2 = std::__cxx11::string::empty();
  if (((uVar2 & 1) == 0) && (bVar1 = std::operator==(propval,"netcore"), !bVar1)) {
    return Managed;
  }
  return Mixed;
}

Assistant:

cmGeneratorTarget::ManagedType cmGeneratorTarget::CheckManagedType(
  std::string const& propval) const
{
  // The type of the managed assembly (mixed unmanaged C++ and C++/CLI,
  // or only C++/CLI) does only depend on whether the property is an empty
  // string or contains any value at all. In Visual Studio generators
  // this propval is prepended with /clr[:] which results in:
  //
  // 1. propval does not exist: no /clr flag, unmanaged target, has import
  //                            lib
  // 2. empty propval:          add /clr as flag, mixed unmanaged/managed
  //                            target, has import lib
  // 3. netcore propval:        add /clr:netcore as flag, mixed
  //                            unmanaged/managed target, has import lib.
  // 4. any value (safe,pure):  add /clr:[propval] as flag, target with
  //                            managed code only, no import lib
  if (propval.empty() || propval == "netcore") {
    return ManagedType::Mixed;
  }
  return ManagedType::Managed;
}